

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetLSetupFrequency(ARKodeMem ark_mem,int msbp)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_10;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetLSetupFrequency",&local_10);
  if (iVar1 == 0) {
    iVar2 = 0x14;
    if (msbp != 0) {
      iVar2 = msbp;
    }
    local_10->msbp = iVar2;
  }
  return iVar1;
}

Assistant:

int mriStep_SetLSetupFrequency(ARKodeMem ark_mem, int msbp)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (msbp == 0) { step_mem->msbp = MSBP; }
  else { step_mem->msbp = msbp; }

  return (ARK_SUCCESS);
}